

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizard::setButtonText(QWizard *this,WizardButton which,QString *text)

{
  QWizardPrivate *this_00;
  bool bVar1;
  QWizardPage *pQVar2;
  long in_FS_OFFSET;
  WizardButton local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  bVar1 = QWizardPrivate::ensureButton(this_00,which);
  if (bVar1) {
    local_2c = which;
    QMap<int,_QString>::insert(&this_00->buttonCustomTexts,&local_2c,text);
    pQVar2 = currentPage(this);
    if (pQVar2 != (QWizardPage *)0x0) {
      pQVar2 = currentPage(this);
      local_2c = which;
      bVar1 = QMap<int,_QString>::contains
                        ((QMap<int,_QString> *)(*(long *)&(pQVar2->super_QWidget).field_0x8 + 0x310)
                         ,&local_2c);
      if (bVar1) goto LAB_004c45a9;
    }
    QAbstractButton::setText(*(QAbstractButton **)((long)&this_00->field_20 + (long)which * 8),text)
    ;
  }
LAB_004c45a9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::setButtonText(WizardButton which, const QString &text)
{
    Q_D(QWizard);

    if (!d->ensureButton(which))
        return;

    d->buttonCustomTexts.insert(which, text);

    if (!currentPage() || !currentPage()->d_func()->buttonCustomTexts.contains(which))
        d->btns[which]->setText(text);
}